

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

BIO * BIO_pop(BIO *b)

{
  BIO *ret;
  BIO *bio_local;
  
  if (b == (BIO *)0x0) {
    bio_local = (BIO *)0x0;
  }
  else {
    bio_local = (BIO *)b->ptr;
    b->ptr = (void *)0x0;
  }
  return (BIO *)bio_local;
}

Assistant:

BIO *BIO_pop(BIO *bio) {
  BIO *ret;

  if (bio == NULL) {
    return NULL;
  }
  ret = bio->next_bio;
  bio->next_bio = NULL;
  return ret;
}